

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintdecode.c
# Opt level: O1

size_t read_ints(uint8_t *in,uint32_t *out,int length)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  size_t sVar9;
  uint32_t *out_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  if (length < 0x10) {
    sVar9 = 0;
    uVar5 = 0;
  }
  else {
    uVar6 = 0;
    auVar11._8_8_ = 0x3f803f803f803f80;
    auVar11._0_8_ = 0x3f803f803f803f80;
    auVar12._8_8_ = 0x7f007f007f007f;
    auVar12._0_8_ = 0x7f007f007f007f;
    auVar13._8_8_ = 0x3fff00003fff;
    auVar13._0_8_ = 0x3fff00003fff;
    auVar14._8_8_ = 0x3f8000003f80;
    auVar14._0_8_ = 0x3f8000003f80;
    auVar15._8_8_ = 0x7f0000007f;
    auVar15._0_8_ = 0x7f0000007f;
    auVar16._8_8_ = 0x1fc000001fc000;
    auVar16._0_8_ = 0x1fc000001fc000;
    auVar17[8] = 0x7f;
    auVar17._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar17[9] = 0x7f;
    auVar17[10] = 0x7f;
    auVar17[0xb] = 0x7f;
    auVar17[0xc] = 0x7f;
    auVar17[0xd] = 0x7f;
    auVar17[0xe] = 0x7f;
    auVar17[0xf] = 0x7f;
    auVar18._8_8_ = 0x4000500060007;
    auVar18._0_8_ = 0x4000500060007;
    sVar9 = 0;
    do {
      auVar19 = vlddqu_avx(*(undefined1 (*) [16])(in + sVar9));
      uVar2 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar19[0xf] >> 7) << 0xf;
      if (uVar2 == 0) {
        auVar10 = vpmovsxbd_avx(auVar19);
        auVar20 = vpshufd_avx(auVar19,0x55);
        *(undefined1 (*) [16])(out + uVar6) = auVar10;
        auVar10 = vpmovsxbd_avx(auVar20);
        auVar20 = vpshufd_avx(auVar19,0xee);
        *(undefined1 (*) [16])(out + uVar6 + 4) = auVar10;
        auVar10 = vpmovsxbd_avx(auVar20);
        *(undefined1 (*) [16])(out + uVar6 + 8) = auVar10;
        auVar19 = vpshufd_avx(auVar19,0xff);
        auVar19 = vpmovsxbd_avx(auVar19);
        *(undefined1 (*) [16])(out + uVar6 + 0xc) = auVar19;
        bVar4 = 0x10;
        iVar7 = 0x10;
      }
      else {
        uVar5 = uVar2 & 0xfff;
        bVar1 = combined_lookup[uVar5].index;
        bVar4 = combined_lookup[uVar5].bytes_consumed;
        auVar10 = *(undefined1 (*) [16])("" + (ulong)bVar1 * 0x10);
        if (bVar1 < 0x40) {
          auVar10 = vpshufb_avx(auVar19,auVar10);
          auVar19 = vpsrlw_avx(auVar10,1);
          auVar19 = vpand_avx(auVar19,auVar11);
          auVar10 = vpternlogq_avx512vl(auVar19,auVar10,auVar12,0xf8);
          auVar19 = vpand_avx(auVar10,auVar13);
          *(undefined1 (*) [16])(out + uVar6) = auVar19;
          auVar19 = vpsrld_avx(auVar10,0x10);
          *(long *)(out + uVar6 + 4) = auVar19._0_8_;
          iVar7 = 6;
        }
        else if (bVar1 < 0x91) {
          auVar10 = vpshufb_avx(auVar19,auVar10);
          auVar19 = vpsrld_avx(auVar10,1);
          auVar19 = vpand_avx(auVar19,auVar14);
          auVar20 = vpsrld_avx(auVar10,2);
          auVar19 = vpternlogq_avx512vl(auVar19,auVar10,auVar15,0xf8);
          auVar19 = vpternlogq_avx512vl(auVar19,auVar20,auVar16,0xf8);
          *(undefined1 (*) [16])(out + uVar6) = auVar19;
          iVar7 = 4;
        }
        else {
          auVar19 = vpand_avx(auVar19,auVar17);
          auVar19 = vpshufb_avx(auVar19,auVar10);
          auVar10 = vpsllvw_avx512vl(auVar19,auVar18);
          auVar19 = vpshldq_avx512_vbmi2(auVar10,auVar19,8);
          auVar19 = vpor_avx(auVar19,auVar10);
          auVar19 = vpmovwb_avx512vl(auVar19);
          *(long *)(out + uVar6) = auVar19._0_8_;
          iVar7 = 2;
        }
      }
      sVar9 = sVar9 + bVar4;
      iVar3 = (int)uVar6;
      uVar5 = iVar7 + iVar3;
      uVar6 = (ulong)uVar5;
    } while (iVar7 + 0xf + iVar3 < length);
  }
  if ((int)uVar5 < length) {
    out_00 = out + uVar5;
    lVar8 = (ulong)(uint)length - (ulong)uVar5;
    do {
      uVar5 = read_int(in + sVar9,out_00);
      sVar9 = sVar9 + uVar5;
      out_00 = out_00 + 1;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  return sVar9;
}

Assistant:

size_t read_ints(const uint8_t *in, uint32_t *out, int length) {
  size_t consumed = 0;
  int count;
  for (count = 0; count + 15 < length;) {
    int ints_read;
    consumed += read_int_group(in + consumed, out + count, &ints_read);
    count += ints_read;
  }
  for (; count < length; count++) {
    consumed += read_int(in + consumed, out + count);
  }
  return consumed;
}